

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void update_phase_lfo_channel(FM_OPN *OPN,FM_CH *CH)

{
  byte bVar1;
  uint uVar2;
  UINT32 fn;
  UINT8 kc;
  UINT8 blk;
  int finc;
  INT32 lfo_fn_offset;
  UINT32 fc;
  FM_CH *CH_local;
  FM_OPN *OPN_local;
  
  uVar2 = CH->block_fnum;
  if (lfo_pm_table[(uVar2 & 0x7f0) * 0x10 + CH->pms + OPN->LFO_PM] == 0) {
    CH->SLOT[0].phase = CH->SLOT[0].Incr + CH->SLOT[0].phase;
    CH->SLOT[2].phase = CH->SLOT[2].Incr + CH->SLOT[2].phase;
    CH->SLOT[1].phase = CH->SLOT[1].Incr + CH->SLOT[1].phase;
    CH->SLOT[3].phase = CH->SLOT[3].Incr + CH->SLOT[3].phase;
  }
  else {
    bVar1 = CH->kcode;
    uVar2 = OPN->fn_table
            [uVar2 * 2 + lfo_pm_table[(uVar2 & 0x7f0) * 0x10 + CH->pms + OPN->LFO_PM] & 0xfff] >>
            (7U - (char)(uVar2 >> 0xb) & 0x1f);
    fn = uVar2 + CH->SLOT[0].DT[bVar1];
    if ((int)fn < 0) {
      fn = OPN->fn_max + fn;
    }
    CH->SLOT[0].phase = (fn * CH->SLOT[0].mul >> 1) + CH->SLOT[0].phase;
    fn = uVar2 + CH->SLOT[2].DT[bVar1];
    if ((int)fn < 0) {
      fn = OPN->fn_max + fn;
    }
    CH->SLOT[2].phase = (fn * CH->SLOT[2].mul >> 1) + CH->SLOT[2].phase;
    fn = uVar2 + CH->SLOT[1].DT[bVar1];
    if ((int)fn < 0) {
      fn = OPN->fn_max + fn;
    }
    CH->SLOT[1].phase = (fn * CH->SLOT[1].mul >> 1) + CH->SLOT[1].phase;
    fn = uVar2 + CH->SLOT[3].DT[bVar1];
    if ((int)fn < 0) {
      fn = OPN->fn_max + fn;
    }
    CH->SLOT[3].phase = (fn * CH->SLOT[3].mul >> 1) + CH->SLOT[3].phase;
  }
  return;
}

Assistant:

INLINE void update_phase_lfo_channel(FM_OPN *OPN, FM_CH *CH)
{
	UINT32 fc = CH->block_fnum;

	INT32 lfo_fn_offset = lfo_pm_table[((fc & 0x7f0) << 4) + CH->pms + OPN->LFO_PM];

	if (lfo_fn_offset)  /* LFO phase modulation active */
	{
		int finc;

		/* block & keyscale code are not modified by LFO PM */
		UINT8 blk = fc >> 11;
		UINT8 kc = CH->kcode;

		/* LFO works with one more bit of a precision (12-bit) */
		UINT32 fn = ((fc << 1) + lfo_fn_offset) & 0xfff;

		/* recalculate (frequency) phase increment counter */
		fc = (OPN->fn_table[fn]>>(7-blk));

		/* apply DETUNE & MUL operator specific values */
		finc = fc + CH->SLOT[SLOT1].DT[kc];
		if (finc < 0) finc += OPN->fn_max;
		CH->SLOT[SLOT1].phase += ((finc * CH->SLOT[SLOT1].mul) >> 1);

		finc = fc + CH->SLOT[SLOT2].DT[kc];
		if (finc < 0) finc += OPN->fn_max;
		CH->SLOT[SLOT2].phase += ((finc * CH->SLOT[SLOT2].mul) >> 1);

		finc = fc + CH->SLOT[SLOT3].DT[kc];
		if (finc < 0) finc += OPN->fn_max;
		CH->SLOT[SLOT3].phase += ((finc * CH->SLOT[SLOT3].mul) >> 1);

		finc = fc + CH->SLOT[SLOT4].DT[kc];
		if (finc < 0) finc += OPN->fn_max;
		CH->SLOT[SLOT4].phase += ((finc * CH->SLOT[SLOT4].mul) >> 1);
	}
	else    /* LFO phase modulation  = zero */
	{
			CH->SLOT[SLOT1].phase += CH->SLOT[SLOT1].Incr;
			CH->SLOT[SLOT2].phase += CH->SLOT[SLOT2].Incr;
			CH->SLOT[SLOT3].phase += CH->SLOT[SLOT3].Incr;
			CH->SLOT[SLOT4].phase += CH->SLOT[SLOT4].Incr;
	}
}